

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_ext_resp_err(raft_server *this,rpc_exception *err)

{
  bool bVar1;
  msg_type mVar2;
  int32 iVar3;
  int32 iVar4;
  int iVar5;
  undefined8 uVar6;
  element_type *peVar7;
  element_type *peVar8;
  long *in_RSI;
  raft_server *in_RDI;
  ptr<delayed_task> task;
  executor exec;
  peer_itor pit;
  int32 peer_id;
  msg_type t_msg;
  ptr<peer> p;
  bool timed_out;
  ptr<req_msg> req;
  rpc_exception *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  _Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>_&,_std::shared_ptr<nuraft::req_msg>_&)>
  *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  context *in_stack_fffffffffffffdf8;
  peer *in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  msg_type in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  shared_ptr<nuraft::timer_task<void>_> local_190 [2];
  code *local_168;
  undefined8 local_160;
  string local_100 [32];
  ptr<peer> *in_stack_ffffffffffffff20;
  msg_type in_stack_ffffffffffffff2c;
  raft_server *in_stack_ffffffffffffff30;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_c0;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_b8;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_b0;
  int32 local_a8;
  msg_type local_a4;
  __shared_ptr local_a0 [20];
  undefined4 local_8c;
  string local_88 [55];
  undefined1 local_51;
  string local_50 [64];
  long *local_10;
  
  local_10 = in_RSI;
  rpc_exception::req(in_stack_fffffffffffffdd8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
  if (bVar1) {
    peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25168d);
    in_stack_fffffffffffffe64 = (*peVar8->_vptr_logger[7])();
    if (3 < in_stack_fffffffffffffe64) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2516c6);
      uVar6 = (**(code **)(*local_10 + 0x10))();
      peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2516f1);
      in_stack_fffffffffffffe60 = msg_base::get_type(&peVar7->super_msg_base);
      msg_if_given_abi_cxx11_
                ((char *)local_50,"receive an rpc error response from peer server, %s %d",uVar6,
                 (ulong)in_stack_fffffffffffffe60);
      (*peVar8->_vptr_logger[8])
                (peVar8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_ext_resp_err",0x5b5,local_50);
      std::__cxx11::string::~string(local_50);
    }
  }
  peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2517b5);
  mVar2 = msg_base::get_type(&peVar7->super_msg_base);
  if ((mVar2 == install_snapshot_request) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->srv_to_join_), bVar1
     )) {
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x251801);
    iVar4 = peer::get_id((peer *)0x251809);
    peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25181c);
    iVar3 = msg_base::get_dst(&peVar7->super_msg_base);
    if (iVar4 == iVar3) {
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffdd8);
      bVar1 = check_snapshot_timeout
                        (in_RDI,(ptr<peer> *)
                                CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x251880);
      local_51 = bVar1;
      if (!bVar1) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
        if (bVar1) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2518cc);
          in_stack_fffffffffffffe34 = (*peVar8->_vptr_logger[7])();
          if (2 < in_stack_fffffffffffffe34) {
            in_stack_fffffffffffffe28 =
                 (peer *)std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x2518ff);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x251918);
            in_stack_fffffffffffffe30 = peer::get_id((peer *)0x251920);
            msg_if_given_abi_cxx11_
                      ((char *)local_88,
                       "sending snapshot to joining server %d failed, retry with temp heartbeat",
                       (ulong)in_stack_fffffffffffffe30);
            (**(code **)&((in_stack_fffffffffffffe28->config_).
                          super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->field_0x40)
                      (in_stack_fffffffffffffe28,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"handle_ext_resp_err",0x5bd,local_88);
            std::__cxx11::string::~string(local_88);
          }
        }
        std::atomic<bool>::operator=
                  ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        enable_hb_for_peer((raft_server *)
                           CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                           in_stack_fffffffffffffe28);
      }
    }
  }
  peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x251a20);
  mVar2 = msg_base::get_type(&peVar7->super_msg_base);
  if (mVar2 != sync_log_request) {
    peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x251a44);
    mVar2 = msg_base::get_type(&peVar7->super_msg_base);
    if (mVar2 != join_cluster_request) {
      peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x251a68);
      mVar2 = msg_base::get_type(&peVar7->super_msg_base);
      if (mVar2 != leave_cluster_request) {
        local_8c = 1;
        goto LAB_00251f89;
      }
    }
  }
  std::shared_ptr<nuraft::peer>::shared_ptr((shared_ptr<nuraft::peer> *)0x251a9c);
  peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x251aa9);
  local_a4 = msg_base::get_type(&peVar7->super_msg_base);
  peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x251acf);
  local_a8 = msg_base::get_dst(&peVar7->super_msg_base);
  if (local_a4 == leave_cluster_request) {
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                 *)in_stack_fffffffffffffdd8,(key_type *)0x251b12);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )in_stack_fffffffffffffdd8);
    local_c0._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)in_stack_fffffffffffffdd8);
    bVar1 = std::__detail::operator!=(&local_b0,&local_c0);
    if (bVar1) {
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x251b7f);
      std::shared_ptr<nuraft::peer>::operator=
                ((shared_ptr<nuraft::peer> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffdd8);
    }
  }
  else {
    std::shared_ptr<nuraft::peer>::operator=
              ((shared_ptr<nuraft::peer> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffdd8);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_a0);
  if (bVar1) {
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x251bfa);
    iVar4 = peer::get_current_hb_interval((peer *)0x251c02);
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x251c1c);
    context::get_params(in_stack_fffffffffffffdf8);
    std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x251c3b);
    iVar5 = raft_params::max_hb_interval
                      ((raft_params *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0))
    ;
    std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x251c56);
    if (iVar4 < iVar5) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
      if (bVar1) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x251d32);
        in_stack_fffffffffffffdf0 = (*peVar8->_vptr_logger[7])();
        if (4 < in_stack_fffffffffffffdf0) {
          in_stack_fffffffffffffde8 =
               (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>_&,_std::shared_ptr<nuraft::req_msg>_&)>
                *)std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x251d65);
          msg_if_given_abi_cxx11_((char *)local_100,"retry the request");
          (**(code **)((long)&(((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                               &in_stack_fffffffffffffde8->_M_f)->_M_ptr->rpc_protector_).
                              super___mutex_base._M_mutex + 0x10))
                    (in_stack_fffffffffffffde8,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_ext_resp_err",0x5dd,local_100);
          std::__cxx11::string::~string(local_100);
        }
      }
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x251df5);
      peer::slow_down_hb((peer *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      local_168 = on_retryable_req_err;
      local_160 = 0;
      std::
      bind<void(nuraft::raft_server::*)(std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::req_msg>&),nuraft::raft_server*,std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::req_msg>&>
                ((offset_in_raft_server_to_subr *)in_stack_fffffffffffffdf8,
                 (raft_server **)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffde8,
                 (shared_ptr<nuraft::req_msg> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      std::function<void()>::
      function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::req_msg>&)>,void>
                ((function<void_()> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffde8);
      std::
      _Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>_&,_std::shared_ptr<nuraft::req_msg>_&)>
      ::~_Bind((_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::req_msg>))(std::shared_ptr<nuraft::peer>_&,_std::shared_ptr<nuraft::req_msg>_&)>
                *)0x251e7d);
      cs_new<nuraft::timer_task<void>,std::function<void()>&>
                ((function<void_()> *)in_stack_fffffffffffffdd8);
      std::shared_ptr<nuraft::delayed_task>::shared_ptr<nuraft::timer_task<void>,void>
                ((shared_ptr<nuraft::delayed_task> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),local_190);
      std::shared_ptr<nuraft::timer_task<void>_>::~shared_ptr
                ((shared_ptr<nuraft::timer_task<void>_> *)0x251eb6);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x251ec3);
      iVar4 = peer::get_current_hb_interval((peer *)0x251ecb);
      schedule_task((raft_server *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                    (ptr<delayed_task> *)in_stack_fffffffffffffde8,iVar4);
      std::shared_ptr<nuraft::delayed_task>::~shared_ptr
                ((shared_ptr<nuraft::delayed_task> *)0x251ef9);
      std::function<void_()>::~function((function<void_()> *)0x251f06);
    }
    else {
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffdd8);
      handle_join_leave_rpc_err
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x251cb0);
    }
    local_8c = 0;
  }
  else {
    local_8c = 1;
  }
  std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x251f89);
LAB_00251f89:
  std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x251f96);
  return;
}

Assistant:

void raft_server::handle_ext_resp_err(rpc_exception& err) {
    ptr<req_msg> req = err.req();
    p_in( "receive an rpc error response from peer server, %s %d",
          err.what(), req->get_type() );

    if ( req->get_type() == msg_type::install_snapshot_request ) {
        if (srv_to_join_ && srv_to_join_->get_id() == req->get_dst()) {
            bool timed_out = check_snapshot_timeout(srv_to_join_);
            if (!timed_out) {
                // Enable temp HB to retry snapshot.
                p_wn("sending snapshot to joining server %d failed, "
                     "retry with temp heartbeat", srv_to_join_->get_id());
                srv_to_join_snp_retry_required_ = true;
                enable_hb_for_peer(*srv_to_join_);
            }
        }
    }

    if ( req->get_type() != msg_type::sync_log_request     &&
         req->get_type() != msg_type::join_cluster_request &&
         req->get_type() != msg_type::leave_cluster_request ) {
        return;
    }

    ptr<peer> p;
    msg_type t_msg = req->get_type();
    int32 peer_id = req->get_dst();
    if (t_msg == msg_type::leave_cluster_request) {
        peer_itor pit = peers_.find(peer_id);
        if (pit != peers_.end()) {
            p = pit->second;
        }
    } else {
        p = srv_to_join_;
    }
    if (!p) return;

    if (p->get_current_hb_interval() >= ctx_->get_params()->max_hb_interval()) {
        handle_join_leave_rpc_err(t_msg, p);

    } else {
        // reuse the heartbeat interval value to indicate
        // when to stop retrying, as rpc backoff is the same.
        p_db("retry the request");
        p->slow_down_hb();
        timer_task<void>::executor exec =
            (timer_task<void>::executor)
            std::bind( &raft_server::on_retryable_req_err, this, p, req );
        ptr<delayed_task> task(cs_new<timer_task<void>>(exec));
        schedule_task(task, p->get_current_hb_interval());
    }
}